

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

uint8_t * wirehair::SIMDSafeAllocate(size_t size)

{
  uint uVar1;
  void *pvVar2;
  long in_RDI;
  uint offset;
  uint8_t *data;
  uint8_t *local_8;
  
  pvVar2 = calloc(1,in_RDI + 0x20);
  if (pvVar2 == (void *)0x0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    uVar1 = (uint)pvVar2 & 0x1f;
    local_8 = (uint8_t *)((long)pvVar2 + (ulong)(0x20 - uVar1));
    local_8[-1] = (uint8_t)uVar1;
  }
  return local_8;
}

Assistant:

uint8_t* SIMDSafeAllocate(size_t size)
{
    uint8_t* data = (uint8_t*)calloc(1, GF256_ALIGN_BYTES + size);
    if (!data) {
        return nullptr;
    }
    unsigned offset = (unsigned)((uintptr_t)data % GF256_ALIGN_BYTES);
    data += GF256_ALIGN_BYTES - offset;
    data[-1] = (uint8_t)offset;
    return data;
}